

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O2

int replay_display_menu(nh_menuitem *items,int icount,char *title,int how,int *results)

{
  int *piVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  long lVar4;
  nh_menuitem *pnVar5;
  long lVar6;
  bool bVar7;
  undefined8 uStack_38;
  int val;
  
  if (how == 0) {
    lVar6 = 0;
  }
  else {
    uStack_38 = in_RAX;
    pcVar3 = next_log_token();
    if ((pcVar3 == (char *)0x0) || (*pcVar3 != 'm')) {
      parse_error("Bad menu data");
    }
    if (pcVar3[2] == 'x') {
      lVar6 = -1;
    }
    else {
      pcVar3 = pcVar3 + 3;
      lVar6 = 0;
      while( true ) {
        iVar2 = __isoc99_sscanf(pcVar3,"%x:",&val);
        if (iVar2 == 0) break;
        lVar4 = 0;
        bVar7 = false;
        pnVar5 = items;
        while ((lVar4 < icount && (!bVar7))) {
          piVar1 = &pnVar5->id;
          lVar4 = lVar4 + 1;
          pnVar5 = pnVar5 + 1;
          bVar7 = *piVar1 == val;
        }
        if (!bVar7) {
          parse_error("Invalid menu id in menu data");
        }
        results[lVar6] = val;
        lVar6 = lVar6 + 1;
        pcVar3 = strchr(pcVar3,0x3a);
        pcVar3 = pcVar3 + 1;
      }
    }
  }
  return (int)lVar6;
}

Assistant:

static int replay_display_menu(struct nh_menuitem *items, int icount,
				const char *title, int how, int *results)
{
    int i, j, val;
    char *token;
    char *resultbuf;
    boolean id_ok;
    
    if (how == PICK_NONE)
	return 0;
    
    token = next_log_token();
    if (!token || token[0] != 'm')
	parse_error("Bad menu data");
    resultbuf = token + 2;
    
    if (*resultbuf++ == 'x')
	return -1;
    
    i = 0;
    while (sscanf(resultbuf, "%x:", &val)) {
	/* make sure all ids are valid - program changes could have broken the save */
	id_ok  = FALSE;
	for (j = 0; j < icount && !id_ok; j++)
	    if (items[j].id == val)
		id_ok = TRUE;
	if (!id_ok)
	    parse_error("Invalid menu id in menu data");
	
	results[i++] = val;
	resultbuf = strchr(resultbuf, ':') + 1;
    }

    return i;
}